

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O3

vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> * __thiscall
tinyusdz::lerp<std::array<float,2ul>>
          (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
           *__return_storage_ptr__,tinyusdz *this,
          vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *a,
          vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *b,double t)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  size_type sVar4;
  ulong __new_size;
  
  (__return_storage_ptr__->
  super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = *(long *)(this + 8) - *(long *)this >> 3;
  __new_size = (long)(a->
                     super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(a->
                     super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3;
  if (uVar3 <= __new_size) {
    __new_size = uVar3;
  }
  if (__new_size != 0) {
    ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::resize
              (__return_storage_ptr__,__new_size);
    if (*(long *)(this + 8) - *(long *)this ==
        (long)(a->
              super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>).
              _M_impl.super__Vector_impl_data._M_start) {
      sVar4 = 0;
      do {
        uVar1 = *(undefined8 *)(*(long *)this + sVar4 * 8);
        uVar2 = *(undefined8 *)
                 (a->
                 super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[sVar4]._M_elems;
        *(ulong *)(__return_storage_ptr__->
                  super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[sVar4]._M_elems =
             CONCAT44((float)((ulong)uVar2 >> 0x20) * (float)t +
                      (float)((ulong)uVar1 >> 0x20) * (float)(1.0 - t),
                      (float)uVar2 * (float)t + (float)uVar1 * (float)(1.0 - t));
        sVar4 = sVar4 + 1;
      } while (__new_size != sVar4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}